

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenAddMemoryImport
               (BinaryenModuleRef module,char *internalName,char *externalModuleName,
               char *externalBaseName,uint8_t shared)

{
  Memory *pMVar1;
  pointer pMVar2;
  Name local_b0;
  Name local_a0;
  Name local_90;
  Name local_80 [2];
  Name local_60;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> local_50;
  __single_object memory_1;
  Memory *memory;
  uint8_t shared_local;
  char *externalBaseName_local;
  char *externalModuleName_local;
  char *internalName_local;
  BinaryenModuleRef module_local;
  
  wasm::Name::Name((Name *)&memory_1,internalName);
  pMVar1 = wasm::Module::getMemoryOrNull(module,(Name)_memory_1);
  if (pMVar1 == (Memory *)0x0) {
    std::make_unique<wasm::Memory>();
    wasm::Name::Name(&local_60,internalName);
    pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                       (&local_50);
    wasm::Name::operator=((Name *)pMVar2,&local_60);
    wasm::Name::Name(local_80,externalModuleName);
    pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                       (&local_50);
    wasm::Name::operator=(&(pMVar2->super_Importable).module,local_80);
    wasm::Name::Name(&local_90,externalBaseName);
    pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                       (&local_50);
    wasm::Name::operator=(&(pMVar2->super_Importable).base,&local_90);
    pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                       (&local_50);
    pMVar2->shared = shared != '\0';
    wasm::Module::addMemory(module,&local_50);
    std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr(&local_50);
  }
  else {
    wasm::Name::Name(&local_a0,externalModuleName);
    wasm::Name::operator=(&(pMVar1->super_Importable).module,&local_a0);
    wasm::Name::Name(&local_b0,externalBaseName);
    wasm::Name::operator=(&(pMVar1->super_Importable).base,&local_b0);
  }
  return;
}

Assistant:

void BinaryenAddMemoryImport(BinaryenModuleRef module,
                             const char* internalName,
                             const char* externalModuleName,
                             const char* externalBaseName,
                             uint8_t shared) {
  auto* memory = ((Module*)module)->getMemoryOrNull(internalName);
  if (memory == nullptr) {
    auto memory = std::make_unique<Memory>();
    memory->name = internalName;
    memory->module = externalModuleName;
    memory->base = externalBaseName;
    memory->shared = shared;
    ((Module*)module)->addMemory(std::move(memory));
  } else {
    // already exists so just set module and base
    memory->module = externalModuleName;
    memory->base = externalBaseName;
  }
}